

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O0

void __thiscall tst_future::finallyRejected(tst_future *this)

{
  bool bVar1;
  Type TVar2;
  QString local_b8;
  bool local_9a;
  bool local_99;
  QString *local_98;
  QPromiseBase<int> local_90;
  QPromiseBase<int> local_80;
  undefined1 local_70 [8];
  QString error;
  bool local_4e;
  bool local_4d [21];
  undefined1 local_38 [8];
  QPromise<int> output;
  undefined1 local_20 [8];
  Type input;
  tst_future *this_local;
  
  output.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  TVar2 = QtPromise::resolve<int>
                    ((QtPromise *)local_20,(int *)((long)&output.super_QPromiseBase<int>.m_d.d + 4))
  ;
  QtPromise::QPromiseBase<int>::finally<tst_future::finallyRejected()::__0>
            ((QPromiseBase<int> *)local_38,(QtPromise *)local_20,
             TVar2.super_QPromiseBase<int>.m_d.d.d);
  local_4d[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
  local_4e = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (local_4d,&local_4e,"input.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x161);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    error.d.size._3_1_ = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_38);
    error.d.size._2_1_ = 1;
    bVar1 = QTest::qCompare<bool,bool>
                      ((bool *)((long)&error.d.size + 3),(bool *)((long)&error.d.size + 2),
                       "output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x162);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      QString::QString((QString *)local_70);
      local_98 = (QString *)local_70;
      QtPromise::QPromiseBase<int>::fail<tst_future::finallyRejected()::__1>
                (&local_90,(anon_class_8_1_a7dec128 *)local_38);
      QtPromise::QPromiseBase<int>::wait(&local_80,&local_90);
      QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_80);
      QtPromise::QPromise<int>::~QPromise((QPromise<int> *)&local_90);
      local_99 = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_38);
      local_9a = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_99,&local_9a,"output.isRejected()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x16c);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_b8,"foo");
        bVar1 = QTest::qCompare((QString *)local_70,&local_b8,"error","QString{\"foo\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                                ,0x16d);
        QString::~QString(&local_b8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          error.d.size._4_4_ = 0;
        }
        else {
          error.d.size._4_4_ = 1;
        }
      }
      else {
        error.d.size._4_4_ = 1;
      }
      QString::~QString((QString *)local_70);
    }
    else {
      error.d.size._4_4_ = 1;
    }
  }
  else {
    error.d.size._4_4_ = 1;
  }
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_future::finallyRejected()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            throw MyException{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    QString error;
    output
        .fail([&](const MyException& e) {
            error = e.error();
            return -1;
        })
        .wait();

    QCOMPARE(output.isRejected(), true);
    QCOMPARE(error, QString{"foo"});
}